

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int trex_charnode(TRex *exp,TRexBool isclass)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int node;
  char t;
  TRexBool isclass_local;
  TRex *exp_local;
  
  if (*exp->_p == '\\') {
    exp->_p = exp->_p + 1;
    switch(*exp->_p) {
    case 'A':
    case 'C':
    case 'D':
    case 'P':
    case 'S':
    case 'W':
    case 'X':
    case 'a':
    case 'c':
    case 'd':
    case 'l':
    case 'p':
    case 's':
    case 'u':
    case 'w':
    case 'x':
      cVar1 = *exp->_p;
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_charclass(exp,(int)cVar1);
      break;
    case 'B':
    case 'b':
      if (isclass == 0) {
        iVar2 = trex_newnode(exp,0x10c);
        exp->_nodes[iVar2].left = (int)*exp->_p;
        exp->_p = exp->_p + 1;
        return iVar2;
      }
    default:
      cVar1 = *exp->_p;
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_newnode(exp,(int)cVar1);
      break;
    case 'f':
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_newnode(exp,0xc);
      break;
    case 'n':
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_newnode(exp,10);
      break;
    case 'r':
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_newnode(exp,0xd);
      break;
    case 't':
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_newnode(exp,9);
      break;
    case 'v':
      exp->_p = exp->_p + 1;
      exp_local._4_4_ = trex_newnode(exp,0xb);
    }
  }
  else {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)*exp->_p] & 0x4000) == 0) {
      trex_error(exp,"letter expected");
    }
    cVar1 = *exp->_p;
    exp->_p = exp->_p + 1;
    exp_local._4_4_ = trex_newnode(exp,(int)cVar1);
  }
  return exp_local._4_4_;
}

Assistant:

static int trex_charnode(TRex* exp, TRexBool isclass) {
    TRexChar t;
    if (*exp->_p == TREX_SYMBOL_ESCAPE_CHAR) {
        exp->_p++;
        switch (*exp->_p) {
            case 'n':
                exp->_p++;
                return trex_newnode(exp, '\n');
            case 't':
                exp->_p++;
                return trex_newnode(exp, '\t');
            case 'r':
                exp->_p++;
                return trex_newnode(exp, '\r');
            case 'f':
                exp->_p++;
                return trex_newnode(exp, '\f');
            case 'v':
                exp->_p++;
                return trex_newnode(exp, '\v');
            case 'a':
            case 'A':
            case 'w':
            case 'W':
            case 's':
            case 'S':
            case 'd':
            case 'D':
            case 'x':
            case 'X':
            case 'c':
            case 'C':
            case 'p':
            case 'P':
            case 'l':
            case 'u': {
                t = *exp->_p;
                exp->_p++;
                return trex_charclass(exp, t);
            }
            case 'b':
            case 'B':
                if (!isclass) {
                    int node = trex_newnode(exp, OP_WB);
                    exp->_nodes[node].left = *exp->_p;
                    exp->_p++;
                    return node;
                }
                /* fall through */
            default:
                t = *exp->_p;
                exp->_p++;
                return trex_newnode(exp, t);
        }
    } else if (!scisprint((int)(*exp->_p))) {
        trex_error(exp, _SC("letter expected"));
    }
    t = *exp->_p;
    exp->_p++;
    return trex_newnode(exp, t);
}